

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_loader_impl.c
# Opt level: O0

int mock_loader_impl_clear(loader_impl impl,loader_handle handle)

{
  void *in_RSI;
  loader_impl_mock_handle mock_handle;
  uint local_4;
  
  if (in_RSI != (void *)0x0) {
    free(in_RSI);
  }
  local_4 = (uint)(in_RSI == (void *)0x0);
  return local_4;
}

Assistant:

int mock_loader_impl_clear(loader_impl impl, loader_handle handle)
{
	loader_impl_mock_handle mock_handle = (loader_impl_mock_handle)handle;

	(void)impl;

	if (mock_handle != NULL)
	{
		free(mock_handle);

		return 0;
	}

	return 1;
}